

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_26::BinaryReader::ReadDataSection(BinaryReader *this,Offset section_size)

{
  Index *count;
  int iVar1;
  Result RVar2;
  Index index;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  uint32_t flags;
  Address data_size;
  void *data;
  uint local_44;
  uint local_40;
  undefined4 uStack_3c;
  void *local_38;
  
  iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9c])();
  if (iVar1 == 0) {
    count = &this->num_data_segments_;
    RVar2 = ReadCount(this,count,"data segment count");
    if (RVar2.enum_ == Error) {
      return (Result)Error;
    }
    iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9d])
                      (this->delegate_,(ulong)this->num_data_segments_);
    if (iVar1 == 0) {
      if ((this->data_count_ == 0xffffffff) || (this->data_count_ == this->num_data_segments_)) {
        bVar7 = *count != 0;
        if (bVar7) {
          uVar6 = 0;
          do {
            RVar2 = ReadU32Leb128(this,&local_44,"data segment flags");
            if (RVar2.enum_ == Error) {
LAB_00141393:
              if (bVar7) {
                return (Result)Error;
              }
              break;
            }
            if ((local_44 != 0) && ((this->options_->features).bulk_memory_enabled_ != true)) {
              pcVar3 = "invalid memory index %d: bulk memory not allowed";
LAB_0014136d:
              PrintError(this,pcVar3);
              goto LAB_00141393;
            }
            if (7 < local_44) {
              pcVar3 = "invalid data segment flags: %#x";
              goto LAB_0014136d;
            }
            uVar4 = 0;
            if ((local_44 & 2) != 0) {
              RVar2 = ReadU32Leb128(this,&local_40,"data segment memory index");
              if (RVar2.enum_ == Error) goto LAB_00141393;
              uVar4 = (ulong)local_40;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9e])
                              (this->delegate_,uVar6,uVar4,(ulong)(byte)local_44);
            if (iVar1 != 0) {
              pcVar3 = "BeginDataSegment callback failed";
LAB_00141389:
              PrintError(this,pcVar3);
              goto LAB_00141393;
            }
            if ((local_44 & 1) == 0) {
              index = (Index)uVar6;
              iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x9f])();
              if (iVar1 == 0) {
                RVar2 = ReadInitExpr(this,index);
                if (RVar2.enum_ == Error) goto LAB_00141393;
                iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa0])(this->delegate_,uVar6);
                if (iVar1 == 0) goto LAB_001412de;
                pcVar3 = "EndDataSegmentInitExpr callback failed";
              }
              else {
                pcVar3 = "BeginDataSegmentInitExpr callback failed";
              }
              goto LAB_00141389;
            }
LAB_001412de:
            RVar2 = ReadBytes(this,&local_38,(Address *)&local_40,"data segment data");
            if (RVar2.enum_ == Error) goto LAB_00141393;
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa1])
                              (this->delegate_,uVar6,local_38,CONCAT44(uStack_3c,local_40));
            if (iVar1 != 0) {
              pcVar3 = "OnDataSegmentData callback failed";
              goto LAB_00141389;
            }
            iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa2])(this->delegate_,uVar6);
            if (iVar1 != 0) {
              pcVar3 = "EndDataSegment callback failed";
              goto LAB_00141389;
            }
            uVar5 = (Index)uVar6 + 1;
            uVar6 = (ulong)uVar5;
            bVar7 = uVar5 < *count;
          } while (bVar7);
        }
        iVar1 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xa3])();
        if (iVar1 == 0) {
          return (Result)Ok;
        }
        pcVar3 = "EndDataSection callback failed";
      }
      else {
        pcVar3 = "data segment count does not equal count in DataCount section";
      }
    }
    else {
      pcVar3 = "OnDataSegmentCount callback failed";
    }
  }
  else {
    pcVar3 = "BeginDataSection callback failed";
  }
  PrintError(this,pcVar3);
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadDataSection(Offset section_size) {
  CALLBACK(BeginDataSection, section_size);
  CHECK_RESULT(ReadCount(&num_data_segments_, "data segment count"));
  CALLBACK(OnDataSegmentCount, num_data_segments_);
  // If the DataCount section is not present, then data_count_ will be invalid.
  ERROR_UNLESS(
      data_count_ == kInvalidIndex || data_count_ == num_data_segments_,
      "data segment count does not equal count in DataCount section");
  for (Index i = 0; i < num_data_segments_; ++i) {
    uint32_t flags;
    CHECK_RESULT(ReadU32Leb128(&flags, "data segment flags"));
    ERROR_IF(flags != 0 && !options_.features.bulk_memory_enabled(),
             "invalid memory index %d: bulk memory not allowed", flags);
    ERROR_IF(flags > SegFlagMax, "invalid data segment flags: %#x", flags);
    Index memory_index(0);
    if (flags & SegExplicitIndex) {
      CHECK_RESULT(ReadIndex(&memory_index, "data segment memory index"));
    }
    CALLBACK(BeginDataSegment, i, memory_index, flags);
    if (!(flags & SegPassive)) {
      CALLBACK(BeginDataSegmentInitExpr, i);
      CHECK_RESULT(ReadInitExpr(i));
      CALLBACK(EndDataSegmentInitExpr, i);
    }

    Address data_size;
    const void* data;
    CHECK_RESULT(ReadBytes(&data, &data_size, "data segment data"));
    CALLBACK(OnDataSegmentData, i, data, data_size);
    CALLBACK(EndDataSegment, i);
  }
  CALLBACK0(EndDataSection);
  return Result::Ok;
}